

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewwidget.cpp
# Opt level: O0

int __thiscall QPrintPreviewWidgetPrivate::calcCurrentPage(QPrintPreviewWidgetPrivate *this)

{
  PageItem *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  QGraphicsItem **ppQVar4;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QRect QVar5;
  int area;
  PageItem *pg;
  QGraphicsItem *item;
  QList<QGraphicsItem_*> *__range1;
  int newPage;
  int maxArea;
  QRect overlap;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QGraphicsItem_*> items;
  QRect viewRect;
  QRect *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int local_b0;
  int local_ac;
  undefined1 local_80 [24];
  QRect local_68;
  undefined1 local_58 [16];
  QGraphicsItem **local_48;
  const_iterator local_40;
  const_iterator local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  QRect local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_ac = 0;
  local_b0 = *(int *)(in_RDI + 0x268);
  local_18.x2.m_i = -0x55555556;
  local_18.y2.m_i = -0x55555556;
  local_18.x1.m_i = -0x55555556;
  local_18.y1.m_i = -0x55555556;
  QAbstractScrollArea::viewport();
  local_18 = QWidget::rect(in_RDI);
  local_30 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  QGraphicsView::items((QRect *)&local_30,(ItemSelectionMode)*(undefined8 *)(in_RDI + 600));
  local_38.i = (QGraphicsItem **)0xaaaaaaaaaaaaaaaa;
  local_38 = QList<QGraphicsItem_*>::begin
                       ((QList<QGraphicsItem_*> *)
                        CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  local_40.i = (QGraphicsItem **)0xaaaaaaaaaaaaaaaa;
  local_40 = QList<QGraphicsItem_*>::end
                       ((QList<QGraphicsItem_*> *)
                        CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  while( true ) {
    local_48 = local_40.i;
    bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_38,local_40);
    if (!bVar1) break;
    ppQVar4 = QList<QGraphicsItem_*>::const_iterator::operator*(&local_38);
    this_00 = (PageItem *)*ppQVar4;
    local_58._0_8_ = 0xaaaaaaaaaaaaaaaa;
    local_58._8_8_ = 0xaaaaaaaaaaaaaaaa;
    QGraphicsItem::sceneBoundingRect();
    QGraphicsView::mapFromScene((QRectF *)local_80);
    QVar5 = (QRect)QPolygon::boundingRect();
    local_68 = QVar5;
    local_58 = QRect::operator&(&local_68,(QRect *)&local_18);
    QPolygon::~QPolygon((QPolygon *)0x1587ce);
    iVar2 = QRect::width(in_stack_ffffffffffffff08);
    iVar3 = QRect::height(in_stack_ffffffffffffff08);
    iVar2 = iVar2 * iVar3;
    if (local_ac < iVar2) {
      local_b0 = QtPrivate::PageItem::pageNumber(this_00);
      local_ac = iVar2;
    }
    else if (iVar2 == local_ac) {
      iVar3 = QtPrivate::PageItem::pageNumber(this_00);
      if (iVar3 < local_b0) {
        local_b0 = QtPrivate::PageItem::pageNumber(this_00);
      }
    }
    QList<QGraphicsItem_*>::const_iterator::operator++(&local_38);
  }
  QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x15886e);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_b0;
}

Assistant:

int QPrintPreviewWidgetPrivate::calcCurrentPage()
{
    int maxArea = 0;
    int newPage = curPage;
    QRect viewRect = graphicsView->viewport()->rect();
    const QList<QGraphicsItem*> items = graphicsView->items(viewRect);
    for (auto *item : items) {
        PageItem* pg = static_cast<PageItem*>(item);
        QRect overlap = graphicsView->mapFromScene(pg->sceneBoundingRect()).boundingRect() & viewRect;
        int area = overlap.width() * overlap.height();
        if (area > maxArea) {
            maxArea = area;
            newPage = pg->pageNumber();
        } else if (area == maxArea && pg->pageNumber() < newPage) {
            newPage = pg->pageNumber();
        }
    }
    return newPage;
}